

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

SceneSignal __thiscall GroundScene::update(GroundScene *this)

{
  pointer *pppOVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer ppOVar6;
  pointer ppOVar7;
  int extraout_var;
  ulong uVar8;
  int j;
  long lVar9;
  pointer __src;
  Object *pOVar10;
  Object *pOVar11;
  Plant *(*papPVar12) [10];
  ulong uVar13;
  int i;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  stringstream debugString;
  ulong local_1e0;
  string local_1d8;
  ObjectSignal local_1b8;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar2 = this->score;
  if (uVar2 == 0) {
    local_1e0 = 0;
    uVar5 = 10;
  }
  else {
    this->score = 0;
    local_1e0 = (ulong)uVar2 << 0x20;
    uVar5 = 0xd;
  }
  ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = this->sunVectorN;
  papPVar12 = this->plants;
  lVar14 = 0;
  do {
    lVar9 = 0;
    do {
      if ((*papPVar12)[lVar9] != (Plant *)0x0) {
        iVar3 = (*((*papPVar12)[lVar9]->super_Charactor).super_Object._vptr_Object[3])();
        if ((char)iVar3 != '\0') {
          (*papPVar12)[lVar9] = (Plant *)0x0;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 10);
    lVar14 = lVar14 + 1;
    papPVar12 = papPVar12 + 1;
  } while (lVar14 != 5);
  ppOVar7 = ppOVar7 + iVar4;
  while (ppOVar7 !=
         (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    iVar4 = (*(*ppOVar7)->_vptr_Object[3])();
    if ((char)iVar4 == '\0') {
      ppOVar7 = ppOVar7 + 1;
    }
    else {
      __src = ppOVar7 + 1;
      ppOVar6 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (__src != ppOVar6) {
        memmove(ppOVar7,__src,(long)ppOVar6 - (long)__src);
      }
      pppOVar1 = &(this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + -1;
    }
  }
  if (this->count == 0x50) {
    genSunRandom(this);
    iVar4 = 0;
  }
  else {
    iVar4 = this->count + 1;
  }
  this->count = iVar4;
  iVar4 = this->sunVectorN;
  ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)iVar4 <
      (ulong)((long)(this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppOVar7 >> 3)) {
    uVar13 = (ulong)(iVar4 + 1);
    uVar8 = (long)iVar4;
    do {
      uVar16 = uVar8 + 1;
      ppOVar6 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (uVar16 < (ulong)((long)(this->objects).
                                 super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)ppOVar6 >> 3)) {
        iVar4 = ppOVar7[uVar8]->type % 10;
        uVar15 = uVar13;
        do {
          pOVar11 = ppOVar6[uVar15];
          iVar3 = pOVar11->type % 10;
          if (iVar4 != iVar3) {
            if ((iVar4 == 5) && (iVar3 == 4)) {
              (*ppOVar6[uVar8]->_vptr_Object[7])();
            }
            else if ((iVar4 == 3) && (iVar3 == 4)) {
              (*ppOVar6[uVar8]->_vptr_Object[0x11])();
              ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pOVar11 = ppOVar7[uVar15];
              pOVar10 = ppOVar7[uVar8];
LAB_0010d0cc:
              (*pOVar11->_vptr_Object[0xe])(pOVar11,pOVar10);
            }
            else if (iVar4 == 4) {
              if (iVar3 == 5) {
                (*pOVar11->_vptr_Object[7])(pOVar11,ppOVar6[uVar8]);
              }
              else if (iVar3 == 3) {
                (*pOVar11->_vptr_Object[0x11])(pOVar11,ppOVar6[uVar8]);
                ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                pOVar11 = ppOVar7[uVar8];
                pOVar10 = ppOVar7[uVar15];
                goto LAB_0010d0cc;
              }
            }
          }
          uVar15 = uVar15 + 1;
          ppOVar6 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar15 < (ulong)((long)(this->objects).
                                        super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppOVar6 >>
                                 3));
      }
      ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = uVar13 + 1;
      uVar8 = uVar16;
    } while (uVar16 < (ulong)((long)(this->objects).
                                    super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppOVar7 >> 3));
  }
  ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar7) {
    uVar8 = 0;
    do {
      (**ppOVar7[uVar8]->_vptr_Object)();
      local_1b8.type =
           (*(this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8]->_vptr_Object[2])();
      local_1b8.data = extraout_var;
      processObjSignal(this,&local_1b8);
      if (this->state == 5) {
        uVar5 = 0xe;
        goto LAB_0010d257;
      }
      uVar8 = uVar8 + 1;
      ppOVar7 = (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->objects).
                                   super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppOVar7 >> 3));
  }
  randomGenZombie(this);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"n: ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  drawText(0,0x2f,&local_1d8,0,0xf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_0010d257:
  return (SceneSignal)(uVar5 | local_1e0);
}

Assistant:

SceneSignal GroundScene::update(){
	SceneSignal signal(GS_SIGNAL_NULL, 0);
	if(score != 0){
		signal.type = GS_SIGNAL_ADD_SCORE;
		signal.data = score;
		score = 0;
	}
	std::vector<Object*>::iterator ite = objects.begin()+sunVectorN;
	for(int i = 0; i < GSBH; ++i){
		for(int j = 0; j < GSBW; ++j){
			if(plants[i][j] != NULL && plants[i][j]->getIsDead()){
				plants[i][j] = NULL;
			}
		}
	}
	while(ite != objects.end()){
		if((*ite)->getIsDead()){
			ite = objects.erase(ite);
		}
		else{
			ite++;
		}
	}
	if(count == SUNFLOWER_GEN_SUN_SPEED){
		genSunRandom();
		count = 0;
	}
	else{
		count++;
	}
	for(int i = sunVectorN; i < objects.size(); ++i){
		int type0 = objects[i]->type%10;
		for(int j = i+1; j < objects.size(); ++j){
			int type1 = objects[j]->type%10;
			if(type0 == type1){
				continue;
			}
			else{
				if(type0 == OBJ_TYPE_BULLET && type1 == OBJ_TYPE_ZOMBIE){
					/* drawText(0, SH+2, "here1", BLACK, WHITE); */
					((Bullet*)objects[i])->interactive((Zombie*)objects[j]);
				}
				else if(type0 == OBJ_TYPE_PLANT && type1 == OBJ_TYPE_ZOMBIE){
					((Plant*)objects[i])->interactive((Zombie*)objects[j]);
					((Zombie*)objects[j])->interactive((Plant*)objects[i]);
				}
				else if(type0 == OBJ_TYPE_ZOMBIE){
					if(type1 == OBJ_TYPE_PLANT){
						((Plant*)objects[j])->interactive((Zombie*)objects[i]);
						((Zombie*)objects[i])->interactive((Plant*)objects[j]);
					}
					else if(type1 == OBJ_TYPE_BULLET){
						/* drawText(0, SH+2, "here2", BLACK, WHITE); */
						((Bullet*)objects[j])->interactive((Zombie*)objects[i]);
					}
				}
			}
		}
	}
	for(int i = 0; i < objects.size(); ++i){
		objects[i]->update();
		ObjectSignal os = objects[i]->getSignal();
		processObjSignal(os);
		if(state == STATE_OVER){
			signal.type = GS_SIGNAL_OVER; 
			return signal;
		}
	}
	randomGenZombie();


	std::stringstream debugString;
	debugString << "n: " << objects.size();
	drawText(0, SH+1, debugString.str(), BLACK, WHITE);
	return signal;
}